

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_abilities
               (textblock *tb,monster_race *race,monster_lore_conflict *lore,bitflag *known_flags)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  monster_sex_t sex;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *__s2;
  wchar_t local_84;
  wchar_t susc_flag;
  monster_sex_t msex;
  bitflag test_flags [12];
  bitflag current_flags [12];
  _Bool prev;
  char *initial_pronoun;
  char start [40];
  wchar_t flag;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    sex = lore_monster_sex(race);
    pcVar5 = lore_pronoun_nominative(sex,true);
    create_mon_flag_mask(test_flags + 4,8,0xf);
    flag_inter(test_flags + 4,known_flags,0xc);
    strnfmt((char *)&initial_pronoun,0x28,"%s can ",pcVar5);
    lore_append_clause(tb,test_flags + 4,'\x01',(char *)&initial_pronoun,"and",".  ");
    create_mon_flag_mask(test_flags + 4,7,0xf);
    flag_inter(test_flags + 4,known_flags,0xc);
    strnfmt((char *)&initial_pronoun,0x28,"%s is ",pcVar5);
    lore_append_clause(tb,test_flags + 4,'\x01',(char *)&initial_pronoun,"and",".  ");
    _Var2 = flag_has_dbg(known_flags,0xc,0x16,"known_flags","RF_UNAWARE");
    if (_Var2) {
      textblock_append(tb,"%s disguises itself as something else.  ",pcVar5);
    }
    _Var2 = flag_has_dbg(known_flags,0xc,0x17,"known_flags","RF_MULTIPLY");
    if (_Var2) {
      textblock_append_c(tb,'\x03',"%s breeds explosively.  ",pcVar5);
    }
    _Var2 = flag_has_dbg(known_flags,0xc,0x18,"known_flags","RF_REGENERATE");
    if (_Var2) {
      textblock_append(tb,"%s regenerates quickly.  ",pcVar5);
    }
    _Var2 = flag_has_dbg(known_flags,0xc,0x22,"known_flags","RF_FLYING");
    if (_Var2) {
      textblock_append(tb,"%s can fly.  ",pcVar5);
    }
    _Var2 = flag_has_dbg(known_flags,0xc,0x25,"known_flags","RF_TERRITORIAL");
    if (_Var2) {
      pcVar6 = lore_pronoun_possessive(sex,false);
      textblock_append(tb,"%s is more aggressive in %s own territory.  ",pcVar5,pcVar6);
    }
    if (race->light < L'\x02') {
      if (race->light == L'\x01') {
        textblock_append(tb,"%s is illuminated.  ",pcVar5);
      }
      else if (race->light == L'\xffffffff') {
        textblock_append(tb,"%s is darkened.  ",pcVar5);
      }
      else if (race->light < L'\xffffffff') {
        pcVar6 = lore_pronoun_possessive(sex,false);
        textblock_append(tb,"%s shrouds %s surroundings in darkness.  ",pcVar5,pcVar6);
      }
    }
    else {
      pcVar6 = lore_pronoun_possessive(sex,false);
      textblock_append(tb,"%s illuminates %s surroundings.  ",pcVar5,pcVar6);
    }
    create_mon_flag_mask(test_flags + 4,0xb,0xc,0xf);
    flag_inter(test_flags + 4,known_flags,0xc);
    strnfmt((char *)&initial_pronoun,0x28,"%s is hurt by ",pcVar5);
    lore_append_clause(tb,test_flags + 4,'\x11',(char *)&initial_pronoun,"and","");
    _Var2 = flag_is_empty(test_flags + 4,0xc);
    bVar1 = !_Var2;
    create_mon_flag_mask(test_flags + 4,0xd,0xf);
    flag_inter(test_flags + 4,known_flags,0xc);
    create_mon_flag_mask((bitflag *)((long)&susc_flag + 3),0xb,0xf);
    for (start._36_4_ = flag_next((bitflag *)((long)&susc_flag + 3),0xc,1); start._36_4_ != 0;
        start._36_4_ = flag_next((bitflag *)((long)&susc_flag + 3),0xc,start._36_4_ + 1)) {
      _Var2 = flag_has_dbg(lore->flags,0xc,start._36_4_,"lore->flags","flag");
      if ((_Var2) &&
         (_Var2 = flag_has_dbg(known_flags,0xc,start._36_4_,"known_flags","flag"), !_Var2)) {
        flag_on_dbg(test_flags + 4,0xc,start._36_4_,"current_flags","flag");
      }
    }
    if (bVar1) {
      my_strcpy((char *)&initial_pronoun,", but resists ",0x28);
    }
    else {
      strnfmt((char *)&initial_pronoun,0x28,"%s resists ",pcVar5);
    }
    lore_append_clause(tb,test_flags + 4,'\x0f',(char *)&initial_pronoun,"and","");
    _Var2 = flag_is_empty(test_flags + 4,0xc);
    current_flags[4] = !_Var2 || bVar1;
    flag_wipe(test_flags + 4,0xc);
    create_mon_flag_mask((bitflag *)((long)&susc_flag + 3),0xd,0xf);
    for (start._36_4_ = flag_next((bitflag *)((long)&susc_flag + 3),0xc,1); start._36_4_ != 0;
        start._36_4_ = flag_next((bitflag *)((long)&susc_flag + 3),0xc,start._36_4_ + 1)) {
      _Var3 = flag_has_dbg(lore->flags,0xc,start._36_4_,"lore->flags","flag");
      if ((_Var3) &&
         (_Var3 = flag_has_dbg(known_flags,0xc,start._36_4_,"known_flags","flag"), !_Var3)) {
        flag_on_dbg(test_flags + 4,0xc,start._36_4_,"current_flags","flag");
      }
    }
    create_mon_flag_mask((bitflag *)((long)&susc_flag + 3),0xc,0xf);
    flag_inter((bitflag *)((long)&susc_flag + 3),known_flags,0xc);
    for (start._36_4_ = flag_next((bitflag *)((long)&susc_flag + 3),0xc,1); start._36_4_ != 0;
        start._36_4_ = flag_next((bitflag *)((long)&susc_flag + 3),0xc,start._36_4_ + 1)) {
      for (local_84 = flag_next(test_flags + 4,0xc,1); local_84 != L'\0';
          local_84 = flag_next(test_flags + 4,0xc,local_84 + L'\x01')) {
        pcVar6 = describe_race_flag(start._36_4_);
        __s2 = describe_race_flag(local_84);
        iVar4 = strcmp(pcVar6,__s2);
        if (iVar4 == 0) {
          flag_off(test_flags + 4,0xc,local_84);
        }
      }
    }
    if (!_Var2 || bVar1) {
      my_strcpy((char *)&initial_pronoun,", and does not resist ",0x28);
    }
    else {
      strnfmt((char *)&initial_pronoun,0x28,"%s does not resist ",pcVar5);
    }
    _Var2 = flag_has_dbg(known_flags,0xc,0x49,"known_flags","RF_UNDEAD");
    if (_Var2) {
      flag_off(test_flags + 4,0xc,0x55);
    }
    lore_append_clause(tb,test_flags + 4,'\x0f',(char *)&initial_pronoun,"or","");
    _Var2 = flag_is_empty(test_flags + 4,0xc);
    if (!_Var2) {
      current_flags[4] = true;
    }
    create_mon_flag_mask(test_flags + 4,0xe,0xf);
    flag_inter(test_flags + 4,known_flags,0xc);
    if ((bool)current_flags[4]) {
      my_strcpy((char *)&initial_pronoun,", and cannot be ",0x28);
    }
    else {
      strnfmt((char *)&initial_pronoun,0x28,"%s cannot be ",pcVar5);
    }
    lore_append_clause(tb,test_flags + 4,'\x0f',(char *)&initial_pronoun,"or","");
    _Var2 = flag_is_empty(test_flags + 4,0xc);
    if (!_Var2) {
      current_flags[4] = true;
    }
    if ((bool)current_flags[4]) {
      textblock_append(tb,".  ");
    }
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                ,0x50b,
                "void lore_append_abilities(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_abilities(textblock *tb, const struct monster_race *race,
						   const struct monster_lore *lore,
						   bitflag known_flags[RF_SIZE])
{
	int flag;
	char start[40];
	const char *initial_pronoun;
	bool prev = false;
	bitflag current_flags[RF_SIZE], test_flags[RF_SIZE];
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) and get a pronoun for the start of
	 * sentences */
	msex = lore_monster_sex(race);
	initial_pronoun = lore_pronoun_nominative(msex, true);

	/* Describe environment-shaping abilities. */
	create_mon_flag_mask(current_flags, RFT_ALTER, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s can ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_WHITE, start, "and", ".  ");

	/* Describe detection traits */
	create_mon_flag_mask(current_flags, RFT_DET, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s is ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_WHITE, start, "and", ".  ");

	/* Describe special things */
	if (rf_has(known_flags, RF_UNAWARE))
		textblock_append(tb, "%s disguises itself as something else.  ",
						 initial_pronoun);
	if (rf_has(known_flags, RF_MULTIPLY))
		textblock_append_c(tb, COLOUR_ORANGE, "%s breeds explosively.  ",
						   initial_pronoun);
	if (rf_has(known_flags, RF_REGENERATE))
		textblock_append(tb, "%s regenerates quickly.  ", initial_pronoun);
	if (rf_has(known_flags, RF_FLYING))
		textblock_append(tb, "%s can fly.  ", initial_pronoun);
	if (rf_has(known_flags, RF_TERRITORIAL))
		textblock_append(tb, "%s is more aggressive in %s own territory.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));

	/* Describe light */
	if (race->light > 1) {
		textblock_append(tb, "%s illuminates %s surroundings.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));
	} else if (race->light == 1) {
		textblock_append(tb, "%s is illuminated.  ", initial_pronoun);
	} else if (race->light == -1) {
		textblock_append(tb, "%s is darkened.  ", initial_pronoun);
	} else if (race->light < -1) {
		textblock_append(tb, "%s shrouds %s surroundings in darkness.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));
	}

	/* Collect susceptibilities */
	create_mon_flag_mask(current_flags, RFT_VULN, RFT_VULN_I, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s is hurt by ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_VIOLET, start, "and", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect immunities and resistances */
	create_mon_flag_mask(current_flags, RFT_RES, RFT_MAX);
	rf_inter(current_flags, known_flags);

	/* Note lack of vulnerability as a resistance */
	create_mon_flag_mask(test_flags, RFT_VULN, RFT_MAX);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		if (rf_has(lore->flags, flag) && !rf_has(known_flags, flag)) {
			rf_on(current_flags, flag);
		}
	}
	if (prev) {
		my_strcpy(start, ", but resists ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s resists ", initial_pronoun);
	}
	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "and", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect known but average susceptibilities */
	rf_wipe(current_flags);
	create_mon_flag_mask(test_flags, RFT_RES, RFT_MAX);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		if (rf_has(lore->flags, flag) && !rf_has(known_flags, flag)) {
			rf_on(current_flags, flag);
		}
	}

	/* Vulnerabilities need to be specifically removed */
	create_mon_flag_mask(test_flags, RFT_VULN_I, RFT_MAX);
	rf_inter(test_flags, known_flags);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		int susc_flag;
		for (susc_flag = rf_next(current_flags, FLAG_START); susc_flag;
			 susc_flag = rf_next(current_flags, susc_flag + 1)) {
			if (streq(describe_race_flag(flag), describe_race_flag(susc_flag)))
				rf_off(current_flags, susc_flag);
		}
	}
	if (prev) {
		my_strcpy(start, ", and does not resist ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s does not resist ",
			initial_pronoun);
	}

	/* Special case for undead */
	if (rf_has(known_flags, RF_UNDEAD)) {
		rf_off(current_flags, RF_IM_NETHER);
	}

	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "or", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect non-effects */
	create_mon_flag_mask(current_flags, RFT_PROT, RFT_MAX);
	rf_inter(current_flags, known_flags);
	if (prev) {
		my_strcpy(start, ", and cannot be ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s cannot be ", initial_pronoun);
	}
	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "or", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	if (prev)
		textblock_append(tb, ".  ");
}